

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExternalFunction.cpp
# Opt level: O0

Var Js::JavascriptExternalFunction::WrappedFunctionThunk
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  Var *values;
  undefined4 *puVar3;
  Type *this;
  ThreadContext *pTVar4;
  JavascriptExternalFunction *pJVar5;
  FunctionInfo *this_00;
  JavascriptMethod p_Var6;
  JavascriptExternalFunction **ppJVar7;
  JavascriptExternalFunction *this_01;
  Var pvVar8;
  Arguments local_80 [2];
  undefined1 local_60 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  ScriptContext *scriptContext;
  JavascriptExternalFunction *externalFunction;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  n = _count_args(callInfo);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&externalFunction,(CallInfo *)&function_local,values);
  this = Memory::WriteBarrierPtr<Js::Type>::operator->(&function->type);
  autoReentrancyHandler._8_8_ = Js::Type::GetScriptContext(this);
  pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)autoReentrancyHandler._8_8_);
  bVar2 = ThreadContext::IsDisableImplicitException(pTVar4);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf7,
                                "(!scriptContext->GetThreadContext()->IsDisableImplicitException())"
                                ,"!scriptContext->GetThreadContext()->IsDisableImplicitException()")
    ;
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  ScriptContext::VerifyAlive((ScriptContext *)autoReentrancyHandler._8_8_,0,(ScriptContext *)0x0);
  pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)autoReentrancyHandler._8_8_);
  bVar2 = ThreadContext::IsScriptActive(pTVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xf9,"(scriptContext->GetThreadContext()->IsScriptActive())",
                                "scriptContext->GetThreadContext()->IsScriptActive()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  externalFunction =
       (JavascriptExternalFunction *)
       ((ulong)externalFunction & 0xffffffff00ffffff |
       (ulong)((uint)((ulong)externalFunction >> 0x18) & 0xff | 0x20) << 0x18);
  pJVar5 = Memory::WriteBarrierPtr<Js::JavascriptExternalFunction>::operator->
                     ((WriteBarrierPtr<Js::JavascriptExternalFunction> *)&function[5].type);
  this_00 = JavascriptFunction::GetFunctionInfo((JavascriptFunction *)pJVar5);
  p_Var6 = FunctionInfo::GetOriginalEntryPoint(this_00);
  if (p_Var6 != ExternalFunctionThunk) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptExternalFunction.cpp"
                                ,0xff,
                                "(externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk)"
                                ,
                                "externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  pTVar4 = ScriptContext::GetThreadContext((ScriptContext *)autoReentrancyHandler._8_8_);
  AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_60,pTVar4);
  ppJVar7 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptExternalFunction__
                      ((WriteBarrierPtr *)&function[5].type);
  pJVar5 = *ppJVar7;
  this_01 = Memory::WriteBarrierPtr<Js::JavascriptExternalFunction>::operator->
                      ((WriteBarrierPtr<Js::JavascriptExternalFunction> *)&function[5].type);
  p_Var6 = RecyclableObject::GetEntryPoint((RecyclableObject *)this_01);
  Arguments::Arguments(local_80,(Arguments *)&externalFunction);
  pvVar8 = JavascriptFunction::CallFunction<true>((RecyclableObject *)pJVar5,p_Var6,local_80,false);
  AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_60);
  return pvVar8;
}

Assistant:

Var JavascriptExternalFunction::WrappedFunctionThunk(RecyclableObject* function, CallInfo callInfo, ...)
    {
        ARGUMENTS(args, callInfo);
        JavascriptExternalFunction* externalFunction = static_cast<JavascriptExternalFunction*>(function);
        ScriptContext* scriptContext = externalFunction->type->GetScriptContext();
        Assert(!scriptContext->GetThreadContext()->IsDisableImplicitException());
        scriptContext->VerifyAlive();
        Assert(scriptContext->GetThreadContext()->IsScriptActive());

        // Make sure the callee knows we are a wrapped function thunk
        args.Info.Flags = (Js::CallFlags) (((int32) args.Info.Flags) | CallFlags_Wrapped);

        // don't need to leave script here, ExternalFunctionThunk will
        Assert(externalFunction->wrappedMethod->GetFunctionInfo()->GetOriginalEntryPoint() == JavascriptExternalFunction::ExternalFunctionThunk);
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            return JavascriptFunction::CallFunction<true>(externalFunction->wrappedMethod, externalFunction->wrappedMethod->GetEntryPoint(), args);
        }
        END_SAFE_REENTRANT_CALL
    }